

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

time_t Time::timeGM(tm *tm)

{
  uint uVar1;
  int iVar2;
  time_t tVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  uVar1 = tm->tm_mon;
  if (((ulong)uVar1 < 0xc) && (iVar2 = tm->tm_year, 0x45 < iVar2)) {
    uVar6 = (iVar2 - (uint)(uVar1 < 2)) + 0x76c;
    iVar4 = (uint)timeGM::moff[uVar1] + tm->tm_mday + -1;
    tm->tm_yday = iVar4;
    lVar5 = (long)tm->tm_sec +
            ((long)tm->tm_min +
            ((long)tm->tm_hour +
            ((long)(int)(((uVar6 >> 2) - uVar6 / 100) + uVar6 / 400 + -0x1dd) +
            (long)iVar4 + (ulong)(iVar2 - 0x46) * 0x16d) * 0x18) * 0x3c) * 0x3c;
    tVar3 = -1;
    if (-1 < lVar5) {
      tVar3 = lVar5;
    }
    return tVar3;
  }
  return -1;
}

Assistant:

static time_t timeGM(struct tm * tm)
    {
        // Common cummulative year days before the given month
        static const unsigned short moff[12] = { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334 };

        if ((unsigned)tm->tm_mon >= 12) return (time_t)-1;
        
        if (tm->tm_year < 70)
            return (time_t) -1;

        int y = tm->tm_year + 1900 - (tm->tm_mon < 2);
        
        int nleapdays = y / 4 - y / 100 + y / 400 - (1969 / 4 - 1969 / 100 + 1969 / 400);
        tm->tm_yday = moff[tm->tm_mon] + tm->tm_mday - 1; // Fix up tm_yday
        
        time_t t = ((((time_t) (tm->tm_year - 70) * 365 + tm->tm_yday + nleapdays) * 24 +
            tm->tm_hour) * 60 + tm->tm_min) * 60 + tm->tm_sec;

        return (t < 0 ? (time_t)-1 : t);
    }